

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::Matcher::MatchLeadingTrailingSpaces
          (Matcher *this,Char *input,CharCount inputLength,CharCount offset)

{
  uint64 *puVar1;
  Char CVar2;
  GroupInfo *pGVar3;
  Type pRVar4;
  Program *pPVar5;
  code *pcVar6;
  bool bVar7;
  undefined4 *puVar8;
  ulong uVar9;
  CharCount CVar10;
  uint uVar11;
  
  if (((this->program).ptr)->numGroups == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                       "groupId >= 0 && groupId < program->numGroups");
    if (!bVar7) goto LAB_00eecfa6;
    *puVar8 = 0;
  }
  pGVar3 = (this->groupInfos).ptr;
  if (inputLength < offset) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x14ec,"(offset <= inputLength)","offset <= inputLength");
    if (!bVar7) goto LAB_00eecfa6;
    *puVar8 = 0;
  }
  if ((((this->program).ptr)->flags & MultilineRegexFlag) != NoRegexFlags) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x14ed,"((program->flags & MultilineRegexFlag) == 0)",
                       "(program->flags & MultilineRegexFlag) == 0");
    if (!bVar7) goto LAB_00eecfa6;
    *puVar8 = 0;
  }
  if (offset < inputLength) {
    CVar10 = offset;
    if (offset == 0) {
      pRVar4 = this->stats;
      uVar9 = 0;
      do {
        CVar2 = input[uVar9];
        if ((ulong)(ushort)CVar2 < 0x100) {
          if ((ASCIIChars::classes[(ushort)CVar2] & 4) == 0) goto LAB_00eece69;
        }
        else if ((CVar2 != L'\x1680') &&
                (((ushort)CVar2 < 0x2000 ||
                 (((0x200a < (ushort)CVar2 &&
                   (((0x37 < (ushort)CVar2 - 0x2028 ||
                     ((0x80000000000083U >> ((ulong)((ushort)CVar2 - 0x2028) & 0x3f) & 1) == 0)) &&
                    (CVar2 != L'\xfeff')))) && (CVar2 != L'\x3000')))))) goto LAB_00eece69;
        if (pRVar4 != (Type)0x0) {
          puVar1 = &pRVar4->numCompares;
          *puVar1 = *puVar1 + 1;
        }
        uVar9 = uVar9 + 1;
      } while (inputLength != uVar9);
      uVar9 = (ulong)inputLength;
LAB_00eece69:
      CVar10 = (CharCount)uVar9;
      if ((((this->program).ptr)->rep).boiLiteral2.literal <= CVar10) {
        offset = 0;
        goto LAB_00eecf8c;
      }
    }
    uVar11 = inputLength - 1;
    offset = inputLength;
    if (CVar10 <= uVar11) {
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      do {
        CVar2 = input[uVar11];
        if ((ulong)(ushort)CVar2 < 0x100) {
          if ((ASCIIChars::classes[(ushort)CVar2] & 4) == 0) break;
        }
        else if ((CVar2 != L'\x1680') &&
                (((ushort)CVar2 < 0x2000 ||
                 (((0x200a < (ushort)CVar2 &&
                   ((0x37 < (ushort)CVar2 - 0x2028 ||
                    ((0x80000000000083U >> ((ulong)((ushort)CVar2 - 0x2028) & 0x3f) & 1) == 0)))) &&
                  ((CVar2 != L'\xfeff' && (CVar2 != L'\x3000')))))))) break;
        bVar7 = uVar11 == 0;
        uVar11 = uVar11 - 1;
        if (bVar7) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                             ,0x1515,"(offset > 0)","offset > 0");
          if (!bVar7) goto LAB_00eecfa6;
          *puVar8 = 0;
        }
        if (this->stats != (Type)0x0) {
          puVar1 = &this->stats->numCompares;
          *puVar1 = *puVar1 + 1;
        }
      } while (CVar10 <= uVar11);
      offset = uVar11 + 1;
    }
    CVar10 = inputLength - offset;
    if (CVar10 < (((this->program).ptr)->rep).leadingTrailingSpaces.endMinMatch) {
LAB_00eecf85:
      CVar10 = 0xffffffff;
      bVar7 = false;
      goto LAB_00eecf93;
    }
  }
  else {
    if (offset != inputLength) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x14f1,"(offset == inputLength)","offset == inputLength");
      if (!bVar7) {
LAB_00eecfa6:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar8 = 0;
    }
    pPVar5 = (this->program).ptr;
    if ((pPVar5->rep).leadingTrailingSpaces.endMinMatch == 0) {
      CVar10 = 0;
    }
    else {
      CVar10 = 0;
      if ((offset != 0) || ((pPVar5->rep).boiLiteral2.literal != 0)) goto LAB_00eecf85;
    }
  }
LAB_00eecf8c:
  pGVar3->offset = offset;
  bVar7 = true;
LAB_00eecf93:
  pGVar3->length = CVar10;
  return bVar7;
}

Assistant:

inline bool Matcher::MatchLeadingTrailingSpaces(const Char* const input, const CharCount inputLength, CharCount offset)
    {
        GroupInfo* const info = GroupIdToGroupInfo(0);
        Assert(offset <= inputLength);
        Assert((program->flags & MultilineRegexFlag) == 0);

        if (offset >= inputLength)
        {
            Assert(offset == inputLength);
            if (program->rep.leadingTrailingSpaces.endMinMatch == 0 ||
                (offset == 0 && program->rep.leadingTrailingSpaces.beginMinMatch == 0))
            {
                info->offset = offset;
                info->length = 0;
                return true;
            }
            info->Reset();
            return false;
        }

        const StandardChars<Char> &stdchrs = *standardChars;
        if (offset == 0)
        {
            while (offset < inputLength && stdchrs.IsWhitespaceOrNewline(input[offset]))
            {
                offset++;
#if ENABLE_REGEX_CONFIG_OPTIONS
                CompStats();
#endif
            }
            if (offset >= program->rep.leadingTrailingSpaces.beginMinMatch)
            {
                info->offset = 0;
                info->length = offset;
                return true;
            }
        }

        Assert(inputLength > 0);
        const CharCount initOffset = offset;
        offset = inputLength - 1;
        while (offset >= initOffset && stdchrs.IsWhitespaceOrNewline(input[offset]))
        {
            // This can never underflow since initOffset > 0
            Assert(offset > 0);
            offset--;
#if ENABLE_REGEX_CONFIG_OPTIONS
            CompStats();
#endif
        }
        offset++;
        CharCount length = inputLength - offset;
        if (length >= program->rep.leadingTrailingSpaces.endMinMatch)
        {
            info->offset = offset;
            info->length = length;
            return true;
        }
        info->Reset();
        return false;
    }